

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

bool deqp::gls::BuiltinPrecisionTests::inputLess<tcu::Vector<float,2>>
               (Vector<float,_2> *val1,Vector<float,_2> *val2)

{
  bool bVar1;
  int ndx;
  long lVar2;
  byte bVar3;
  
  bVar1 = true;
  lVar2 = 0;
  do {
    bVar3 = 1;
    if ((val1->m_data[lVar2] < val2->m_data[lVar2]) ||
       (bVar3 = 0, val2->m_data[lVar2] < val1->m_data[lVar2])) break;
    bVar3 = 0;
    lVar2 = lVar2 + 1;
    bVar1 = lVar2 == 1;
  } while (bVar1);
  return (bool)(bVar1 & bVar3);
}

Assistant:

bool inputLess (const T& val1, const T& val2)
{
	return InputLess<T>()(val1, val2);
}